

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_light.h
# Opt level: O1

SceneLight * __thiscall CGL::GLScene::PointLight::get_static_light(PointLight *this)

{
  Vector3D VVar1;
  Vector3D VVar2;
  PointLight *this_00;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffe0;
  
  this_00 = (PointLight *)operator_new(0x50);
  VVar1.field_0._24_8_ = in_stack_ffffffffffffffc0;
  VVar1.field_0.field_0 = (this->position).field_0.field_0;
  VVar2.field_0._24_8_ = in_stack_ffffffffffffffe0;
  VVar2.field_0.field_0 = (this->spectrum).field_0.field_0;
  CGL::SceneObjects::PointLight::PointLight(this_00,VVar1,VVar2);
  return (SceneLight *)this_00;
}

Assistant:

SceneObjects::SceneLight *get_static_light() const {
    SceneObjects::PointLight *l = 
      new SceneObjects::PointLight(spectrum, position);
    return l;
  }